

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall
slang::parsing::Lexer::create<slang::LiteralBase&,bool>
          (Lexer *this,TokenKind kind,LiteralBase *args,bool *args_1)

{
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  int iVar1;
  undefined4 extraout_var;
  size_t in_RCX;
  char *in_RDX;
  EVP_PKEY_CTX *src;
  Token *extraout_RDX;
  undefined8 *in_RDI;
  string_view sVar2;
  SourceLocation location;
  Lexer *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  BufferID in_stack_ffffffffffffff64;
  Token *this_00;
  SourceLocation in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [12];
  undefined4 uVar3;
  LiteralBase in_stack_ffffffffffffffe0;
  Token local_10;
  BumpAllocator *alloc;
  
  uVar3 = *(undefined4 *)(in_RDI + 10);
  SourceLocation::SourceLocation
            ((SourceLocation *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff64,(uint64_t)in_stack_ffffffffffffff50);
  iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy
                    ((SmallVectorBase<slang::parsing::Trivia> *)(in_RDI + 0x10),
                     (EVP_PKEY_CTX *)*in_RDI,src);
  alloc = (BumpAllocator *)CONCAT44(extraout_var,iVar1);
  this_00 = extraout_RDX;
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
  span<slang::parsing::Trivia,_18446744073709551615UL>
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff64.id,in_stack_ffffffffffffff60),
             (span<slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  sVar2 = lexeme(in_stack_ffffffffffffff50);
  trivia._M_extent._M_extent_value._4_4_ = uVar3;
  trivia._0_12_ = in_stack_ffffffffffffffb8;
  rawText._M_str = in_RDX;
  rawText._M_len = in_RCX;
  Token::Token(this_00,alloc,sVar2._M_str._6_2_,trivia,rawText,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffe0,sVar2._M_str._5_1_);
  return local_10;
}

Assistant:

Token Lexer::create(TokenKind kind, Args&&... args) {
    SourceLocation location(bufferId, size_t(marker - originalBegin));
    return Token(alloc, kind, triviaBuffer.copy(alloc), lexeme(), location,
                 std::forward<Args>(args)...);
}